

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_run_container_inplace_union(array_container_t *src_1,run_container_t *src_2)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  uint uVar4;
  run_container_t *in_RSI;
  int *in_RDI;
  rle16_t previousrle;
  int src2nruns;
  int32_t arraypos;
  int32_t rlepos;
  rle16_t *inputsrc2;
  int32_t neededcapacity;
  int32_t maxoutput;
  rle16_t local_30;
  int32_t local_2c;
  undefined4 in_stack_ffffffffffffffd8;
  int32_t in_stack_ffffffffffffffdc;
  run_container_t *in_stack_ffffffffffffffe0;
  rle16_t *prVar5;
  
  _Var2 = run_container_is_full(in_RSI);
  if (!_Var2) {
    iVar3 = *in_RDI + in_RSI->n_runs;
    if (in_RSI->capacity < iVar3 + in_RSI->n_runs) {
      run_container_grow(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                         SUB41((uint)in_stack_ffffffffffffffd8 >> 0x18,0));
    }
    memmove(in_RSI->runs + iVar3,in_RSI->runs,(long)in_RSI->n_runs << 2);
    prVar5 = in_RSI->runs + iVar3;
    iVar3 = 0;
    local_2c = in_RSI->n_runs;
    in_RSI->n_runs = 0;
    bVar1 = **(ushort **)(in_RDI + 2) < prVar5->value;
    if (bVar1) {
      local_30 = run_container_append_value_first(in_RSI,**(uint16_t **)(in_RDI + 2));
    }
    else {
      local_30 = run_container_append_first(in_RSI,*prVar5);
      iVar3 = iVar3 + 1;
    }
    uVar4 = (uint)bVar1;
    while( true ) {
      bVar1 = false;
      if (iVar3 < local_2c) {
        bVar1 = (int)uVar4 < *in_RDI;
      }
      if (!bVar1) break;
      if (*(ushort *)(*(long *)(in_RDI + 2) + (long)(int)uVar4 * 2) < prVar5[iVar3].value) {
        run_container_append_value
                  (in_RSI,*(uint16_t *)(*(long *)(in_RDI + 2) + (long)(int)uVar4 * 2),&local_30);
        uVar4 = uVar4 + 1;
      }
      else {
        run_container_append(in_RSI,prVar5[iVar3],&local_30);
        iVar3 = iVar3 + 1;
      }
    }
    if ((int)uVar4 < *in_RDI) {
      for (; (int)uVar4 < *in_RDI; uVar4 = uVar4 + 1) {
        run_container_append_value
                  (in_RSI,*(uint16_t *)(*(long *)(in_RDI + 2) + (long)(int)uVar4 * 2),&local_30);
      }
    }
    else {
      for (; iVar3 < local_2c; iVar3 = iVar3 + 1) {
        run_container_append(in_RSI,prVar5[iVar3],&local_30);
      }
    }
  }
  return;
}

Assistant:

void array_run_container_inplace_union(const array_container_t *src_1,
                                       run_container_t *src_2) {
    if (run_container_is_full(src_2)) {
        return;
    }
    const int32_t maxoutput = src_1->cardinality + src_2->n_runs;
    const int32_t neededcapacity = maxoutput + src_2->n_runs;
    if (src_2->capacity < neededcapacity)
        run_container_grow(src_2, neededcapacity, true);
    memmove(src_2->runs + maxoutput, src_2->runs,
            src_2->n_runs * sizeof(rle16_t));
    rle16_t *inputsrc2 = src_2->runs + maxoutput;
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    int src2nruns = src_2->n_runs;
    src_2->n_runs = 0;

    rle16_t previousrle;

    if (inputsrc2[rlepos].value <= src_1->array[arraypos]) {
        previousrle = run_container_append_first(src_2, inputsrc2[rlepos]);
        rlepos++;
    } else {
        previousrle =
            run_container_append_value_first(src_2, src_1->array[arraypos]);
        arraypos++;
    }

    while ((rlepos < src2nruns) && (arraypos < src_1->cardinality)) {
        if (inputsrc2[rlepos].value <= src_1->array[arraypos]) {
            run_container_append(src_2, inputsrc2[rlepos], &previousrle);
            rlepos++;
        } else {
            run_container_append_value(src_2, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    }
    if (arraypos < src_1->cardinality) {
        while (arraypos < src_1->cardinality) {
            run_container_append_value(src_2, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    } else {
        while (rlepos < src2nruns) {
            run_container_append(src_2, inputsrc2[rlepos], &previousrle);
            rlepos++;
        }
    }
}